

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

int TPZShapeHDivConstant<pzshape::TPZShapeTetra>::NHDivShapeF(TPZShapeData *data)

{
  int iVar1;
  int ic;
  long lVar2;
  
  iVar1 = 0;
  for (lVar2 = 6; lVar2 < (int)(data->fHDivNumConnectShape).super_TPZVec<int>.fNElements;
      lVar2 = lVar2 + 1) {
    iVar1 = iVar1 + (data->fHDivNumConnectShape).super_TPZVec<int>.fStore[lVar2];
  }
  return iVar1 + 4;
}

Assistant:

inline int64_t size() const { return fNElements; }